

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86::forwardDilation_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  size_t _elemsize;
  _func_int *p_Var3;
  Allocator *pAVar4;
  _func_int **pp_Var5;
  size_t sVar6;
  size_t sVar7;
  Layer *pLVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  void *pvVar18;
  undefined4 *puVar19;
  undefined4 *puVar20;
  int _w;
  int iVar21;
  ulong uVar22;
  long lVar23;
  undefined4 *puVar24;
  long lVar25;
  uint uVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  Option opt_g;
  void *local_198;
  undefined8 uStack_190;
  size_t sStack_188;
  int iStack_180;
  Allocator *local_178;
  int iStack_170;
  uint uStack_16c;
  uint local_168;
  int iStack_164;
  ulong uStack_160;
  void *local_158;
  undefined8 uStack_150;
  size_t sStack_148;
  int iStack_140;
  Allocator *local_138;
  int iStack_130;
  int iStack_12c;
  uint local_128;
  uint uStack_124;
  ulong uStack_120;
  Mat *local_118;
  int local_10c;
  int local_108;
  int local_104;
  Mat *local_100;
  ulong local_f8;
  long local_f0;
  long local_e8;
  ulong local_e0;
  void *local_d8;
  Allocator *pAStack_d0;
  Allocator *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  long local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar1 = bottom_blob->w;
  iVar12 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  p_Var3 = this->_vptr_Convolution_x86[-3];
  local_e0 = (ulong)*(uint *)(&this->field_0xbc + (long)p_Var3);
  iVar2 = *(int *)(p_Var3 + 0xc + (long)&(this->weight_3x3_winograd23_data_int8).data);
  local_f8 = (ulong)*(uint *)(p_Var3 + 4 + (long)&(this->weight_3x3_winograd23_data_int8).data);
  iVar21 = (*(uint *)(&this->field_0xbc + (long)p_Var3) - 1) *
           *(uint *)(p_Var3 + 4 + (long)&(this->weight_3x3_winograd23_data_int8).data) + 1;
  iVar16 = (iVar1 - iVar21) / iVar2;
  _w = iVar16 + 1;
  local_118 = bottom_blob;
  Mat::create(top_blob,_w,(iVar12 - iVar21) / iVar2 + 1,
              *(int *)(&this->use_winograd3x3_int8 + (long)p_Var3),_elemsize,opt->blob_allocator);
  uVar10 = local_f8;
  iVar21 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    sStack_148 = 0;
    iStack_140 = 0;
    local_158 = (void *)0x0;
    uStack_150 = (int *)0x0;
    local_138 = (Allocator *)0x0;
    iStack_130 = 0;
    iStack_12c = 0;
    local_128 = 0;
    uStack_124 = 0;
    uStack_120 = 0;
    sStack_188 = 0;
    iStack_180 = 0;
    local_198 = (void *)0x0;
    uStack_190 = (int *)0x0;
    local_178 = (Allocator *)0x0;
    iStack_170 = 0;
    uStack_16c = 0;
    local_168 = 0;
    iStack_164 = 0;
    uStack_160 = 0;
    iVar21 = (int)local_f8;
    bVar27 = 0 < iVar21;
    local_100 = top_blob;
    if (0 < iVar21) {
      local_108 = iVar21 + iVar1 + -1;
      local_10c = iVar21 + iVar12 + -1;
      local_a8 = (long)iVar1 << 2;
      local_104 = iVar21 * iVar1;
      local_b0 = (long)iVar16 * 4 + 4;
      local_70 = (long)(_w * iVar21) << 2;
      lVar23 = 0;
      local_68 = ZEXT416(3);
      lVar25 = 0;
      uVar15 = 0;
      uStack_190 = (int *)0x0;
      uStack_150 = (int *)0x0;
      do {
        uVar9 = (long)(local_10c - (int)uVar15) / (long)(int)local_f8;
        uVar11 = (uint)uVar9;
        uVar22 = (long)(int)(uVar11 - (int)local_e0) / (long)iVar2;
        local_80 = uVar22 & 0xffffffff;
        uVar26 = (int)uVar22 + 1;
        local_48 = ZEXT416(uVar11);
        local_58 = ZEXT416(uVar26);
        uVar22 = 0;
        local_f0 = lVar23;
        local_e8 = lVar25;
        local_a0 = uVar15;
        local_98 = lVar25;
        local_90 = lVar23;
        do {
          uVar15 = (long)(local_108 - (int)uVar22) / (long)(int)local_f8;
          iVar12 = (int)uVar15;
          iVar1 = (iVar12 - (int)local_e0) / iVar2;
          uVar17 = local_118->c;
          uVar13 = (ulong)uVar17;
          pAVar4 = opt->workspace_allocator;
          auVar29._0_4_ = -(uint)(local_68._0_4_ == iStack_130);
          auVar29._4_4_ = -(uint)(iVar12 == iStack_12c);
          auVar29._8_4_ = -(uint)(local_48._0_4_ == local_128);
          auVar29._12_4_ = -(uint)(uVar17 == uStack_124);
          iVar16 = movmskps((int)local_f8,auVar29);
          local_88 = uVar22;
          if ((((iVar16 != 0xf) || (iStack_140 != 1)) || (local_138 != pAVar4)) ||
             (sStack_148 != _elemsize)) {
            if (uStack_150 != (int *)0x0) {
              LOCK();
              *uStack_150 = *uStack_150 + -1;
              UNLOCK();
              if (*uStack_150 == 0) {
                if (local_138 == (Allocator *)0x0) {
                  if (local_158 != (void *)0x0) {
                    free(local_158);
                  }
                }
                else {
                  (**(code **)(*(long *)local_138 + 0x18))();
                }
              }
            }
            local_158 = (void *)0x0;
            uStack_150._0_4_ = 0;
            uStack_150._4_4_ = 0;
            uStack_150 = (int *)0x0;
            iStack_140 = 1;
            iStack_130 = 3;
            uVar13 = (long)(int)(uVar11 * iVar12) * _elemsize + 0xf & 0xfffffffffffffff0;
            uStack_120 = uVar13 / _elemsize;
            uVar13 = uVar13 % _elemsize;
            sStack_148 = _elemsize;
            local_138 = pAVar4;
            iStack_12c = iVar12;
            local_128 = uVar11;
            uStack_124 = uVar17;
            if ((long)(int)uVar17 * uStack_120 != 0) {
              uVar13 = (long)(int)uVar17 * uStack_120 * _elemsize + 3 & 0xfffffffffffffffc;
              if (pAVar4 == (Allocator *)0x0) {
                local_d8 = (void *)0x0;
                iVar16 = posix_memalign(&local_d8,0x10,uVar13 + 4);
                local_158 = local_d8;
                if (iVar16 != 0) {
                  local_d8 = (void *)0x0;
                  local_158 = local_d8;
                }
              }
              else {
                local_158 = (void *)(**(code **)(*(long *)pAVar4 + 0x10))(pAVar4,uVar13 + 4);
              }
              uStack_150 = (int *)((long)local_158 + uVar13);
              *(undefined4 *)((long)local_158 + uVar13) = 1;
            }
          }
          if ((local_158 == (void *)0x0) || ((long)(int)uStack_124 * uStack_120 == 0)) {
LAB_00127149:
            iVar21 = -100;
            if (bVar27) goto LAB_00127178;
            goto LAB_00127155;
          }
          uVar17 = iVar1 + 1;
          iVar16 = *(int *)(&this->use_winograd3x3_int8 + (long)this->_vptr_Convolution_x86[-3]);
          pAVar4 = opt->workspace_allocator;
          auVar28._0_4_ = -(uint)(local_68._0_4_ == iStack_170);
          auVar28._4_4_ = -(uint)(uVar17 == uStack_16c);
          auVar28._8_4_ = -(uint)(local_58._0_4_ == local_168);
          auVar28._12_4_ = -(uint)(iVar16 == iStack_164);
          iVar21 = movmskps(uVar17,auVar28);
          if (((iVar21 != 0xf) || ((iStack_180 != 1 || (local_178 != pAVar4)))) ||
             (sStack_188 != _elemsize)) {
            if (uStack_190 != (int *)0x0) {
              LOCK();
              *uStack_190 = *uStack_190 + -1;
              UNLOCK();
              if (*uStack_190 == 0) {
                if (local_178 == (Allocator *)0x0) {
                  if (local_198 != (void *)0x0) {
                    free(local_198);
                  }
                }
                else {
                  (**(code **)(*(long *)local_178 + 0x18))(local_178,local_198,uVar13);
                }
              }
            }
            local_198 = (void *)0x0;
            uStack_190._0_4_ = 0;
            uStack_190._4_4_ = 0;
            uStack_190 = (int *)0x0;
            iStack_180 = 1;
            iStack_170 = 3;
            uStack_160 = ((long)(int)(uVar26 * uVar17) * _elemsize + 0xf & 0xfffffffffffffff0) /
                         _elemsize;
            sStack_188 = _elemsize;
            local_178 = pAVar4;
            uStack_16c = uVar17;
            local_168 = uVar26;
            iStack_164 = iVar16;
            if ((long)iVar16 * uStack_160 != 0) {
              uVar22 = (long)iVar16 * uStack_160 * _elemsize + 3 & 0xfffffffffffffffc;
              if (pAVar4 == (Allocator *)0x0) {
                local_d8 = (void *)0x0;
                iVar16 = posix_memalign(&local_d8,0x10,uVar22 + 4);
                local_198 = local_d8;
                if (iVar16 != 0) {
                  local_d8 = (void *)0x0;
                  local_198 = local_d8;
                }
              }
              else {
                local_198 = (void *)(**(code **)(*(long *)pAVar4 + 0x10))(pAVar4,uVar22 + 4);
              }
              uStack_190 = (int *)((long)local_198 + uVar22);
              *(undefined4 *)((long)local_198 + uVar22) = 1;
            }
          }
          if ((local_198 == (void *)0x0) || ((long)iStack_164 * uStack_160 == 0)) goto LAB_00127149;
          iVar16 = local_118->c;
          if (0 < (long)iVar16) {
            lVar23 = (long)local_118->data + local_e8;
            local_78 = local_118->cstep * local_118->elemsize;
            lVar25 = 0;
            pvVar14 = local_158;
            do {
              if (0 < (int)uVar11) {
                iVar21 = 0;
                uVar22 = 0;
                pvVar18 = pvVar14;
                do {
                  if (0 < iVar12) {
                    puVar19 = (undefined4 *)(lVar23 + (long)iVar21 * 4);
                    uVar13 = 0;
                    do {
                      *(undefined4 *)((long)pvVar18 + uVar13 * 4) = *puVar19;
                      uVar13 = uVar13 + 1;
                      puVar19 = puVar19 + uVar10;
                    } while ((uVar15 & 0xffffffff) != uVar13);
                  }
                  uVar22 = uVar22 + 1;
                  iVar21 = iVar21 + local_104;
                  pvVar18 = (void *)((long)pvVar18 + (long)iVar12 * 4);
                } while (uVar22 != (uVar9 & 0xffffffff));
              }
              lVar25 = lVar25 + 1;
              lVar23 = lVar23 + local_78;
              pvVar14 = (void *)((long)pvVar14 + uStack_120 * sStack_148);
            } while (lVar25 != iVar16);
          }
          local_d8 = *(void **)opt;
          local_c8 = opt->workspace_allocator;
          uStack_c0._0_1_ = opt->use_winograd_convolution;
          uStack_c0._1_1_ = opt->use_sgemm_convolution;
          uStack_c0._2_1_ = opt->use_int8_inference;
          uStack_c0._3_1_ = opt->use_vulkan_compute;
          uStack_c0._4_1_ = opt->use_fp16_packed;
          uStack_c0._5_1_ = opt->use_fp16_storage;
          uStack_c0._6_1_ = opt->use_fp16_arithmetic;
          uStack_c0._7_1_ = opt->use_int8_storage;
          local_b8._0_1_ = opt->use_int8_arithmetic;
          local_b8._1_1_ = opt->use_packing_layout;
          local_b8._2_1_ = opt->use_shader_pack8;
          local_b8._3_1_ = opt->use_bf16_storage;
          local_b8._4_4_ = *(undefined4 *)&opt->field_0x24;
          pAStack_d0 = local_178;
          (*this->convolution_dilation1->_vptr_Layer[7])
                    (this->convolution_dilation1,&local_158,&local_198,&local_d8);
          pp_Var5 = this->_vptr_Convolution_x86;
          if (0 < *(int *)(&this->use_winograd3x3_int8 + (long)pp_Var5[-3])) {
            sVar6 = local_100->cstep;
            puVar19 = (undefined4 *)((long)local_100->data + local_f0);
            sVar7 = local_100->elemsize;
            lVar23 = 0;
            pvVar14 = local_198;
            do {
              if (-1 < (int)local_80) {
                uVar15 = 0;
                puVar24 = puVar19;
                pvVar18 = pvVar14;
                do {
                  if (-1 < iVar1) {
                    uVar22 = 0;
                    puVar20 = puVar24;
                    do {
                      *puVar20 = *(undefined4 *)((long)pvVar18 + uVar22 * 4);
                      uVar22 = uVar22 + 1;
                      puVar20 = puVar20 + uVar10;
                    } while (uVar17 != uVar22);
                  }
                  uVar15 = uVar15 + 1;
                  puVar24 = (undefined4 *)((long)puVar24 + local_70);
                  pvVar18 = (void *)((long)pvVar18 + (long)(int)uVar17 * 4);
                } while (uVar15 != uVar26);
              }
              lVar23 = lVar23 + 1;
              puVar19 = (undefined4 *)((long)puVar19 + sVar6 * sVar7);
              pvVar14 = (void *)((long)pvVar14 + uStack_160 * sStack_188);
            } while (lVar23 < *(int *)(&this->use_winograd3x3_int8 + (long)pp_Var5[-3]));
          }
          uVar22 = local_88 + 1;
          local_e8 = local_e8 + 4;
          local_f0 = local_f0 + 4;
        } while (uVar22 != local_f8);
        uVar15 = local_a0 + 1;
        bVar27 = uVar15 < local_f8;
        lVar25 = local_98 + local_a8;
        lVar23 = local_90 + local_b0;
      } while (uVar15 != local_f8);
    }
LAB_00127155:
    pLVar8 = this->activation;
    iVar21 = 0;
    if (pLVar8 != (Layer *)0x0) {
      (*pLVar8->_vptr_Layer[9])(pLVar8,local_100,opt);
    }
LAB_00127178:
    if (uStack_190 != (int *)0x0) {
      LOCK();
      *uStack_190 = *uStack_190 + -1;
      UNLOCK();
      if (*uStack_190 == 0) {
        if (local_178 == (Allocator *)0x0) {
          if (local_198 != (void *)0x0) {
            free(local_198);
          }
        }
        else {
          (**(code **)(*(long *)local_178 + 0x18))();
        }
      }
    }
    if (uStack_150 != (int *)0x0) {
      LOCK();
      *uStack_150 = *uStack_150 + -1;
      UNLOCK();
      if (*uStack_150 == 0) {
        if (local_138 == (Allocator *)0x0) {
          if (local_158 != (void *)0x0) {
            free(local_158);
          }
        }
        else {
          (**(code **)(*(long *)local_138 + 0x18))();
        }
      }
    }
  }
  return iVar21;
}

Assistant:

int Convolution_x86::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}